

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SstReader::~SstReader(SstReader *this)

{
  SstReader *in_RDI;
  
  ~SstReader(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

SstReader::~SstReader()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }

    if (m_BP5Deserializer)
        delete m_BP5Deserializer;
    SstStreamDestroy(m_Input);
}